

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h265d_parser.c
# Opt level: O2

MPP_RET h265d_deinit(void *ctx)

{
  HEVCFrame *frame;
  HEVCContext *s_00;
  undefined8 *ptr;
  HEVCNAL *ptr_00;
  void *pvVar1;
  SplitContext_t *s;
  long lVar2;
  long lVar3;
  h265d_dxva2_picture_context_t *ctx_pic;
  
  s_00 = *ctx;
  ptr = *(undefined8 **)((long)ctx + 8);
  for (lVar2 = 0xcd0; lVar2 != 0x1110; lVar2 = lVar2 + 0x40) {
    frame = (HEVCFrame *)((long)s_00->vps_list + lVar2 + -0x30);
    mpp_hevc_unref_frame(s_00,frame,-1);
    mpp_frame_deinit((MppFrame *)frame);
  }
  for (lVar2 = 6; lVar2 != 0x16; lVar2 = lVar2 + 1) {
    if (s_00->vps_list[lVar2 + -6] != (RK_U8 *)0x0) {
      mpp_mem_pool_put_f("h265d_deinit",s_00->vps_pool,s_00->vps_list[lVar2 + -6]);
    }
  }
  for (lVar2 = 0x16; lVar2 != 0x26; lVar2 = lVar2 + 1) {
    if (s_00->vps_list[lVar2 + -6] != (RK_U8 *)0x0) {
      mpp_mem_pool_put_f("h265d_deinit",s_00->sps_pool,s_00->vps_list[lVar2 + -6]);
    }
  }
  for (lVar2 = 0x26; lVar2 != 0x66; lVar2 = lVar2 + 1) {
    mpp_hevc_pps_free(s_00->vps_list[lVar2 + -6]);
  }
  mpp_osal_free("h265d_deinit",s_00->HEVClc);
  s_00->HEVClc = (HEVCLocalContext *)0x0;
  lVar2 = 0;
  for (lVar3 = 0; ptr_00 = s_00->nals, lVar3 < s_00->nals_allocated; lVar3 = lVar3 + 1) {
    mpp_osal_free("h265d_deinit",*(void **)((long)&ptr_00->rbsp_buffer + lVar2));
    lVar2 = lVar2 + 0x18;
  }
  if (ptr_00 != (HEVCNAL *)0x0) {
    mpp_osal_free("h265d_deinit",ptr_00);
  }
  if (s_00->pre_pps_data != (void *)0x0) {
    mpp_osal_free("h265d_deinit",s_00->pre_pps_data);
  }
  s_00->pre_pps_data = (void *)0x0;
  s_00->nals_allocated = 0;
  pvVar1 = s_00->hal_pic_private;
  if (pvVar1 != (void *)0x0) {
    if (*(void **)((long)pvVar1 + 0x1e58) != (void *)0x0) {
      mpp_osal_free("h265d_deinit",*(void **)((long)pvVar1 + 0x1e58));
    }
    *(undefined8 *)((long)pvVar1 + 0x1e58) = 0;
    if (*(void **)((long)pvVar1 + 0x1e70) != (void *)0x0) {
      mpp_osal_free("h265d_deinit",*(void **)((long)pvVar1 + 0x1e70));
    }
    *(undefined8 *)((long)pvVar1 + 0x1e70) = 0;
    mpp_osal_free("h265d_deinit",s_00->hal_pic_private);
  }
  if (s_00->input_packet != (MppPacket)0x0) {
    pvVar1 = mpp_packet_get_data(s_00->input_packet);
    mpp_osal_free("h265d_deinit",pvVar1);
    mpp_packet_deinit(&s_00->input_packet);
  }
  if (s_00->vps_pool != (MppMemPool)0x0) {
    mpp_mem_pool_deinit_f("h265d_deinit",s_00->vps_pool);
  }
  if (s_00->sps_pool != (MppMemPool)0x0) {
    mpp_mem_pool_deinit_f("h265d_deinit",s_00->sps_pool);
  }
  if (s_00->hdr_dynamic_meta != (MppFrameHdrDynamicMeta *)0x0) {
    mpp_osal_free("h265d_deinit",s_00->hdr_dynamic_meta);
  }
  s_00->hdr_dynamic_meta = (MppFrameHdrDynamicMeta *)0x0;
  mpp_osal_free("h265d_deinit",s_00);
  if (ptr != (undefined8 *)0x0) {
    if ((void *)*ptr != (void *)0x0) {
      mpp_osal_free("h265d_split_deinit",(void *)*ptr);
      *ptr = 0;
    }
    mpp_osal_free("h265d_split_deinit",ptr);
  }
  return MPP_OK;
}

Assistant:

MPP_RET h265d_deinit(void *ctx)
{
    H265dContext_t *h265dctx = (H265dContext_t *)ctx;
    HEVCContext       *s = h265dctx->priv_data;
    SplitContext_t *sc = h265dctx->split_cxt;
    RK_U8 *buf = NULL;
    int i;

    for (i = 0; i < MAX_DPB_SIZE; i++) {
        mpp_hevc_unref_frame(s, &s->DPB[i], ~0);
        mpp_frame_deinit(&s->DPB[i].frame);
    }

    for (i = 0; i < MAX_VPS_COUNT; i++) {
        if (s->vps_list[i])
            mpp_mem_pool_put(s->vps_pool, s->vps_list[i]);
    }
    for (i = 0; i < MAX_SPS_COUNT; i++) {
        if (s->sps_list[i])
            mpp_mem_pool_put(s->sps_pool, s->sps_list[i]);
    }
    for (i = 0; i < MAX_PPS_COUNT; i++)
        mpp_hevc_pps_free(s->pps_list[i]);

    mpp_free(s->HEVClc);

    s->HEVClc = NULL;

    for (i = 0; i < s->nals_allocated; i++)
        mpp_free(s->nals[i].rbsp_buffer);

    if (s->nals) {
        mpp_free(s->nals);
    }

    MPP_FREE(s->pre_pps_data);

    s->nals_allocated = 0;

    if (s->hal_pic_private) {
        h265d_dxva2_picture_context_t *ctx_pic = (h265d_dxva2_picture_context_t *)s->hal_pic_private;
        MPP_FREE(ctx_pic->slice_short);
        MPP_FREE(ctx_pic->slice_cut_param);
        mpp_free(s->hal_pic_private);
    }
    if (s->input_packet) {
        buf = mpp_packet_get_data(s->input_packet);
        mpp_free(buf);
        mpp_packet_deinit(&s->input_packet);
    }

    if (s->vps_pool)
        mpp_mem_pool_deinit(s->vps_pool);
    if (s->sps_pool)
        mpp_mem_pool_deinit(s->sps_pool);

    MPP_FREE((s->hdr_dynamic_meta));

    if (s) {
        mpp_free(s);
    }

    if (sc) {
        h265d_split_deinit(sc);
    }
    return 0;
}